

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

_Bool mi_heap_page_collect
                (mi_heap_t *heap,mi_page_queue_t *pq,mi_page_t *page,void *arg_collect,void *arg2)

{
  _Bool _Var1;
  mi_segment_t *pmVar2;
  mi_page_t *in_RCX;
  mi_page_t *in_RDX;
  mi_page_queue_t *in_R8;
  mi_segment_t *segment;
  mi_collect_t collect;
  undefined4 in_stack_ffffffffffffffd0;
  uint32_t uVar3;
  
  uVar3 = in_RCX->slice_count;
  _mi_page_free_collect(in_RCX,SUB81((ulong)in_R8 >> 0x38,0));
  if (uVar3 == 1) {
    pmVar2 = _mi_page_segment((mi_page_t *)CONCAT44(1,in_stack_ffffffffffffffd0));
    _mi_segment_collect((mi_segment_t *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),
                        SUB81((ulong)pmVar2 >> 0x38,0));
  }
  _Var1 = mi_page_all_free(in_RDX);
  if (_Var1) {
    _mi_page_free(in_RCX,in_R8,SUB41(uVar3 >> 0x18,0));
  }
  else if (uVar3 == 2) {
    _mi_page_abandon(in_RCX,in_R8);
  }
  return true;
}

Assistant:

static bool mi_heap_page_collect(mi_heap_t* heap, mi_page_queue_t* pq, mi_page_t* page, void* arg_collect, void* arg2 ) {
  MI_UNUSED(arg2);
  MI_UNUSED(heap);
  mi_assert_internal(mi_heap_page_is_valid(heap, pq, page, NULL, NULL));
  mi_collect_t collect = *((mi_collect_t*)arg_collect);
  _mi_page_free_collect(page, collect >= MI_FORCE);
  if (collect == MI_FORCE) {
    // note: call before a potential `_mi_page_free` as the segment may be freed if this was the last used page in that segment.
    mi_segment_t* segment = _mi_page_segment(page);
    _mi_segment_collect(segment, true /* force? */);
  }
  if (mi_page_all_free(page)) {
    // no more used blocks, free the page.
    // note: this will free retired pages as well.
    _mi_page_free(page, pq, collect >= MI_FORCE);
  }
  else if (collect == MI_ABANDON) {
    // still used blocks but the thread is done; abandon the page
    _mi_page_abandon(page, pq);
  }
  return true; // don't break
}